

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manipulation.h
# Opt level: O0

RefNull * wasm::ExpressionManipulator::convert<wasm::Call,wasm::RefNull>(Call *input)

{
  RefNull *output;
  Call *input_local;
  
  RefNull::RefNull((RefNull *)input);
  return (RefNull *)input;
}

Assistant:

inline OutputType* convert(InputType* input) {
  static_assert(sizeof(OutputType) <= sizeof(InputType),
                "Can only convert to a smaller size Expression node");
  input->~InputType(); // arena-allocaed, so no destructor, but avoid UB.
  OutputType* output = (OutputType*)(input);
  new (output) OutputType;
  return output;
}